

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O2

void __thiscall tonk::Connection::onP2PStartConnect(Connection *this,P2PConnectParams *params)

{
  INATPortPool *pIVar1;
  undefined8 uVar2;
  ushort uVar3;
  uint64_t localUsec;
  P2PConnectParams startParams;
  Counter16 local_86;
  UDPAddress local_84;
  undefined8 local_68;
  uint64_t uStack_60;
  undefined8 uStack_58;
  uint64_t uStack_50;
  undefined4 local_48;
  undefined8 local_44;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined8 uStack_30;
  
  local_48._0_2_ = params->SelfExternalPort;
  local_48._2_2_ = params->PeerNATMappedPort;
  local_68 = *(undefined8 *)params;
  uStack_60 = params->EncryptionKey;
  uStack_58._0_2_ = params->ProtocolRoundIntervalMsec;
  uStack_58._2_2_ = params->ShotTS16;
  uStack_58._4_4_ = *(undefined4 *)&params->field_0x14;
  uStack_50 = params->ShotTimeUsec;
  local_44 = *(undefined8 *)&(params->PeerExternalAddress).impl_.data_;
  uVar2 = *(undefined8 *)((long)&(params->PeerExternalAddress).impl_.data_ + 0xc);
  uStack_30 = *(undefined8 *)((long)&(params->PeerExternalAddress).impl_.data_ + 0x14);
  uStack_3c = (undefined4)*(undefined8 *)((long)&(params->PeerExternalAddress).impl_.data_ + 8);
  uStack_38 = (undefined4)uVar2;
  uStack_34 = (undefined4)((ulong)uVar2 >> 0x20);
  localUsec = siamese::GetTimeUsec();
  LOCK();
  (this->LastTickUsec).super___atomic_base<unsigned_long>._M_i = localUsec;
  UNLOCK();
  local_86.Value = params->ShotTS16;
  uStack_50 = TimeSynchronizer::FromLocalTime16(&this->TimeSync,localUsec,&local_86);
  pIVar1 = (this->Deps).NATPool;
  getSelfAddress(&local_84,this);
  uVar3 = swap_bytes(local_84.impl_.data_.v4.sin_port);
  (*pIVar1->_vptr_INATPortPool[2])
            (pIVar1,(ulong)uVar3,(ulong)this->LocallyAssignedIdForRemoteHost,&local_68);
  return;
}

Assistant:

void Connection::onP2PStartConnect(const protocol::P2PConnectParams& params)
{
    protocol::P2PConnectParams startParams = params;
    startParams.ShotTimeUsec = TimeSync.FromLocalTime16(GetTicksUsec(), params.ShotTS16);

    Deps.NATPool->OnP2PStartConnect(
        getSelfAddress().port(),
        LocallyAssignedIdForRemoteHost,
        startParams);
}